

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

args * djb::tab_r::extract_beckmann_args(args *__return_storage_ptr__,tab_r *tab)

{
  int i;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float_t fVar6;
  double dVar7;
  vec3 wm;
  vec3 local_a4;
  double local_98;
  vec3 local_90;
  args local_80;
  
  iVar1 = 0;
  dVar7 = 0.0;
  do {
    fVar2 = (float)iVar1 * 0.001953125;
    fVar3 = fVar2 * fVar2 * 3.1415927 * 0.5;
    local_98 = dVar7;
    fVar4 = cosf(fVar3);
    local_a4.x = sinf(fVar3);
    local_a4.y = 0.0;
    fVar5 = local_a4.x * local_a4.x;
    local_a4.z = fVar4;
    fVar3 = tanf(fVar3);
    local_90.x = 0.0;
    local_90.y = 0.0;
    local_90.z = 1.0;
    microfacet::args::normalmap(&local_80,&local_90,1.0,1.0,0.0);
    fVar6 = microfacet::ndf((microfacet *)tab,&local_a4,&local_80);
    dVar7 = local_98 + (double)(fVar6 * fVar3 * fVar5 * fVar2);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x200);
  dVar7 = dVar7 * 0.0192765723913908 + dVar7 * 0.0192765723913908;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  fVar2 = (float)dVar7;
  fprintf(_stdout,"djb_verbose: Beckmann_alpha = %.9f\n",(double)fVar2);
  local_80.mtra.r[0].x = 0.0;
  local_80.mtra.r[0].y = 0.0;
  local_80.mtra.r[0].z = 1.0;
  microfacet::args::normalmap(__return_storage_ptr__,(vec3 *)&local_80,fVar2,fVar2,0.0);
  return __return_storage_ptr__;
}

Assistant:

microfacet::args tab_r::extract_beckmann_args(const tab_r &tab)
{
	int cnt = 512;
	double du = (double)sqr(m_pi()) / cnt;
	double nint = 0;
	float_t alpha;

	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / cnt;
		float_t tm = sqr(u) * m_pi() / 2;
		float_t zm = cos(tm), z_m = sin(tm);
		vec3 wm = vec3(z_m, 0, zm);

		nint+= (double)(u * sqr(z_m) * tan(tm) * tab.ndf(wm));
	}
	nint*= du;
	alpha = sqrt(2 * nint);

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: Beckmann_alpha = %.9f\n", (double)alpha);
#endif
	return microfacet::args::isotropic(alpha);
}